

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::IteratorStepAndValue
               (RecyclableObject *iterator,ScriptContext *scriptContext,RecyclableObject *nextFunc,
               Var *resultValue)

{
  bool bVar1;
  RecyclableObject *iterResult;
  Var pvVar2;
  RecyclableObject *result;
  Var *resultValue_local;
  RecyclableObject *nextFunc_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *iterator_local;
  
  iterResult = IteratorNext(iterator,scriptContext,nextFunc,(Var)0x0);
  bVar1 = IteratorComplete(iterResult,scriptContext);
  if (!bVar1) {
    pvVar2 = IteratorValue(iterResult,scriptContext);
    *resultValue = pvVar2;
  }
  iterator_local._7_1_ = !bVar1;
  return iterator_local._7_1_;
}

Assistant:

bool JavascriptOperators::IteratorStepAndValue(RecyclableObject* iterator, ScriptContext* scriptContext, RecyclableObject* nextFunc, Var* resultValue)
    {
        // CONSIDER: Fast-pathing for iterators that are built-ins?
        RecyclableObject* result = JavascriptOperators::IteratorNext(iterator, scriptContext, nextFunc);

        if (!JavascriptOperators::IteratorComplete(result, scriptContext))
        {
            *resultValue = JavascriptOperators::IteratorValue(result, scriptContext);
            return true;
        }

        return false;
    }